

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O3

void __thiscall CVmObjBigNum::wp8abs(CVmObjBigNum *this,char *buf,int *ov)

{
  uint32_t tmp_2;
  uint32_t uVar1;
  uint32_t tmp_1;
  uint32_t lo;
  char tmp [25];
  uint32_t local_4c;
  char local_48 [40];
  
  *ov = (uint)(0x1e < *(short *)((this->super_CVmObject).ext_ + 2));
  local_48[0x10] = 0;
  local_48[0x11] = '\0';
  local_48[0x12] = '\0';
  local_48[0x13] = '\0';
  local_48[0x14] = '\0';
  local_48[0x15] = '\0';
  local_48[0x16] = '\0';
  local_48[0x17] = '\0';
  local_48[0x18] = '\0';
  local_48[0] = '\x14';
  local_48[1] = '\0';
  local_48[2] = '\0';
  local_48[3] = '\0';
  local_48[4] = '\0';
  local_48[5] = '\0';
  local_48[6] = '\0';
  local_48[7] = '\0';
  local_48[8] = 0;
  local_48[9] = '\0';
  local_48[10] = '\0';
  local_48[0xb] = '\0';
  local_48[0xc] = '\0';
  local_48[0xd] = '\0';
  local_48[0xe] = '\0';
  local_48[0xf] = '\0';
  copy_val(local_48,(this->super_CVmObject).ext_,1);
  div_by_2e32(local_48,&local_4c);
  uVar1 = convert_to_int_base(local_48,ov);
  *(uint32_t *)buf = local_4c;
  *(uint32_t *)(buf + 4) = uVar1;
  return;
}

Assistant:

void CVmObjBigNum::wp8abs(char *buf, int &ov) const
{
    /* 
     *   as a rough cut, if the number is greater than 10^30, it's definitely
     *   too big for a 64-bit integer buffer 
     */
    ov = (get_exp(ext_) > 30);

    /* 
     *   Make a local copy of the value - we need at most 20 digits of
     *   precision, since we only want the integer part.  
     */
    char tmp[5 + 20] = { 20, 0, 0, 0, 0 };
    copy_val(tmp, ext_, TRUE);

    /* 
     *   Divide the value by 2^32.  This splits the value into two 32-bit
     *   halves for us, which are then easy to arrange into the buffer with
     *   integer arithmetic.  
     */
    uint32_t lo, hi;
    div_by_2e32(tmp, &lo);
    hi = convert_to_int_base(tmp, ov);

    /* 
     *   store the low part in the first four bytes, the high part in the
     *   next four bytes 
     */
    oswp4(buf, lo);
    oswp4(buf + 4, hi);
}